

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O0

void __thiscall kj::std::anon_unknown_0::TestCase49::run(TestCase49 *this)

{
  bool bVar1;
  size_t count;
  ArrayPtr<const_unsigned_char> AVar2;
  ArrayPtr<unsigned_char> AVar3;
  ArrayPtr<unsigned_char> local_2b0;
  ArrayPtr<unsigned_char> local_2a0;
  ArrayPtr<const_unsigned_char> local_290;
  bool local_279;
  undefined1 auStack_278 [7];
  bool _kj_shouldLog;
  size_t local_270;
  ArrayPtr<unsigned_char> local_268;
  ArrayPtr<const_unsigned_char> local_258;
  ArrayPtr<const_unsigned_char> local_248;
  undefined1 local_238 [8];
  DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> _kjCondition;
  size_t amount;
  byte buf [9];
  undefined1 local_1c8 [8];
  StdOutputStream out;
  undefined1 local_1a8 [8];
  StdInputStream in;
  stringstream ss;
  ostream local_188 [376];
  TestCase49 *local_10;
  TestCase49 *this_local;
  
  local_10 = this;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&in.stream_);
  StdInputStream::StdInputStream((StdInputStream *)local_1a8,(istream *)&in.stream_);
  StdOutputStream::StdOutputStream((StdOutputStream *)local_1c8,local_188);
  AVar2 = operator___kjb<kj::_::ByteLiteral<7UL>__102,_111,_111,_98,_97,_114__>();
  register0x00000000 = AVar2.ptr;
  StdOutputStream::write
            ((StdOutputStream *)local_1c8,(int)AVar2.ptr,(void *)AVar2.size_,
             (size_t)register0x00000000);
  buf[0] = '\0';
  amount = 0;
  ArrayPtr<unsigned_char>::ArrayPtr<9ul>
            ((ArrayPtr<unsigned_char> *)&_kjCondition.result,(uchar (*) [9])&amount);
  count = StdInputStream::tryRead((StdInputStream *)local_1a8,stack0xfffffffffffffe00,8);
  local_258 = operator___kjb<kj::_::ByteLiteral<7UL>__102,_111,_111,_98,_97,_114__>();
  local_248 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_258);
  _auStack_278 = arrayPtr<unsigned_char,9ul>((uchar (*) [9])&amount);
  local_268 = ArrayPtr<unsigned_char>::first((ArrayPtr<unsigned_char> *)auStack_278,count);
  kj::_::DebugExpression<kj::ArrayPtr<unsigned_char_const>>::operator==
            ((DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> *)
             local_238,(DebugExpression<kj::ArrayPtr<unsigned_char_const>> *)&local_248,&local_268);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_238);
  if (!bVar1) {
    local_279 = kj::_::Debug::shouldLog(ERROR);
    while (local_279 != false) {
      AVar2 = operator___kjb<kj::_::ByteLiteral<7UL>__102,_111,_111,_98,_97,_114__>();
      local_290 = AVar2;
      AVar3 = arrayPtr<unsigned_char,9ul>((uchar (*) [9])&amount);
      local_2b0 = AVar3;
      AVar3 = ArrayPtr<unsigned_char>::first(&local_2b0,count);
      local_2a0 = AVar3;
      kj::_::Debug::
      log<char_const(&)[65],kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>&,kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/std/iostream-test.c++"
                 ,0x3d,ERROR,
                 "\"failed: expected \" \"(\\\"foobar\\\"_kjb) == (arrayPtr(buf).first(amount))\", _kjCondition, \"foobar\"_kjb, arrayPtr(buf).first(amount)"
                 ,(char (*) [65])
                  "failed: expected (\"foobar\"_kjb) == (arrayPtr(buf).first(amount))",
                 (DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> *
                 )local_238,&local_290,&local_2a0);
      local_279 = false;
    }
  }
  StdOutputStream::~StdOutputStream((StdOutputStream *)local_1c8);
  StdInputStream::~StdInputStream((StdInputStream *)local_1a8);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&in.stream_);
  return;
}

Assistant:

TEST(StdIoStream, TryReadToEndOfFile) {
  // Check that tryRead works when eof is reached before minBytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  out.write("foobar"_kjb);

  byte buf[9]{};
  auto amount = in.tryRead(buf, 8);
  EXPECT_EQ("foobar"_kjb, arrayPtr(buf).first(amount));
}